

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::MessageSetFieldSkipper::SkipMessageSetField
          (MessageSetFieldSkipper *this,CodedInputStream *input,int field_number)

{
  byte bVar1;
  byte *pbVar2;
  UnknownFieldSet *this_00;
  bool bVar3;
  ulong uVar4;
  string *buffer;
  int original_buffer_size;
  uint32_t first_byte_or_zero;
  int count;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (ulong)bVar1;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_0038b1eb;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  if ((long)uVar4 < 0) {
    return false;
  }
LAB_0038b1eb:
  this_00 = (this->super_UnknownFieldSetFieldSkipper).unknown_fields_;
  count = (int)uVar4;
  if (this_00 != (UnknownFieldSet *)0x0) {
    buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_00,field_number);
    bVar3 = io::CodedInputStream::ReadString(input,buffer,count);
    return bVar3;
  }
  if (count < 0) {
    return false;
  }
  original_buffer_size = *(int *)&input->buffer_end_ - (int)input->buffer_;
  if (original_buffer_size < count) {
    bVar3 = io::CodedInputStream::SkipFallback(input,count,original_buffer_size);
    return bVar3;
  }
  input->buffer_ = input->buffer_ + (uVar4 & 0xffffffff);
  return true;
}

Assistant:

bool MessageSetFieldSkipper::SkipMessageSetField(io::CodedInputStream* input,
                                                 int field_number) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  if (unknown_fields_ == nullptr) {
    return input->Skip(length);
  } else {
    return input->ReadString(unknown_fields_->AddLengthDelimited(field_number),
                             length);
  }
}